

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valence_cache.h
# Opt level: O1

void __thiscall
draco::ValenceCache<draco::CornerTable>::ClearValenceCacheInaccurate
          (ValenceCache<draco::CornerTable> *this)

{
  pointer pcVar1;
  pointer pcVar2;
  
  pcVar1 = (this->vertex_valence_cache_8_bit_).vector_.
           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->vertex_valence_cache_8_bit_).vector_.
      super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
      _M_finish != pcVar1) {
    (this->vertex_valence_cache_8_bit_).vector_.
    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar1;
  }
  pcVar2 = (this->vertex_valence_cache_8_bit_).vector_.
           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->vertex_valence_cache_8_bit_).vector_.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->vertex_valence_cache_8_bit_).vector_.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->vertex_valence_cache_8_bit_).vector_.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (pcVar1 != (pointer)0x0) {
    operator_delete(pcVar1,(long)pcVar2 - (long)pcVar1);
    return;
  }
  return;
}

Assistant:

void ClearValenceCacheInaccurate() const {
    vertex_valence_cache_8_bit_.clear();
    // Force erasure.
    IndexTypeVector<VertexIndex, int8_t>().swap(vertex_valence_cache_8_bit_);
  }